

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickle_row.c
# Opt level: O1

void PickleRows_delete(PickleRows *pickle_rows)

{
  PickleCells *pickle_cells;
  long lVar1;
  
  if (pickle_rows != (PickleRows *)0x0) {
    if (pickle_rows->pickle_rows != (PickleRow *)0x0) {
      if (L'\0' < pickle_rows->row_count) {
        lVar1 = 0;
        do {
          pickle_cells = (PickleCells *)pickle_rows->pickle_rows[lVar1].pickle_cells;
          if (pickle_cells != (PickleCells *)0x0) {
            PickleCells_delete(pickle_cells);
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 < pickle_rows->row_count);
      }
      free(pickle_rows->pickle_rows);
    }
    free(pickle_rows);
    return;
  }
  return;
}

Assistant:

void PickleRows_delete(const PickleRows* pickle_rows) {
    if (!pickle_rows) {
        return;
    }
    if (pickle_rows->pickle_rows) {
        int i;
        for(i = 0; i < pickle_rows->row_count; ++i) {
            delete_pickle_row_content(pickle_rows->pickle_rows + i);
        }
        free((void*)pickle_rows->pickle_rows);
    }
    free((void*)pickle_rows);
}